

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

void luv_push_stats_table(lua_State *L,uv_stat_t *s)

{
  char *local_20;
  char *type;
  uv_stat_t *s_local;
  lua_State *L_local;
  
  local_20 = (char *)0x0;
  lua_createtable(L,0,0x17);
  lua_pushinteger(L,s->st_dev);
  lua_setfield(L,-2,"dev");
  lua_pushinteger(L,s->st_mode);
  lua_setfield(L,-2,"mode");
  lua_pushinteger(L,s->st_nlink);
  lua_setfield(L,-2,"nlink");
  lua_pushinteger(L,s->st_uid);
  lua_setfield(L,-2,"uid");
  lua_pushinteger(L,s->st_gid);
  lua_setfield(L,-2,"gid");
  lua_pushinteger(L,s->st_rdev);
  lua_setfield(L,-2,"rdev");
  lua_pushinteger(L,s->st_ino);
  lua_setfield(L,-2,"ino");
  lua_pushinteger(L,s->st_size);
  lua_setfield(L,-2,"size");
  lua_pushinteger(L,s->st_blksize);
  lua_setfield(L,-2,"blksize");
  lua_pushinteger(L,s->st_blocks);
  lua_setfield(L,-2,"blocks");
  lua_pushinteger(L,s->st_flags);
  lua_setfield(L,-2,"flags");
  lua_pushinteger(L,s->st_gen);
  lua_setfield(L,-2,"gen");
  luv_push_timespec_table(L,&s->st_atim);
  lua_setfield(L,-2,"atime");
  luv_push_timespec_table(L,&s->st_mtim);
  lua_setfield(L,-2,"mtime");
  luv_push_timespec_table(L,&s->st_ctim);
  lua_setfield(L,-2,"ctime");
  luv_push_timespec_table(L,&s->st_birthtim);
  lua_setfield(L,-2,"birthtime");
  if ((s->st_mode & 0xf000) == 0x8000) {
    local_20 = "file";
  }
  else if ((s->st_mode & 0xf000) == 0x4000) {
    local_20 = "directory";
  }
  else if ((s->st_mode & 0xf000) == 0xa000) {
    local_20 = "link";
  }
  else if ((s->st_mode & 0xf000) == 0x1000) {
    local_20 = "fifo";
  }
  else if ((s->st_mode & 0xf000) == 0xc000) {
    local_20 = "socket";
  }
  else if ((s->st_mode & 0xf000) == 0x2000) {
    local_20 = "char";
  }
  else if ((s->st_mode & 0xf000) == 0x6000) {
    local_20 = "block";
  }
  if (local_20 != (char *)0x0) {
    lua_pushstring(L,local_20);
    lua_setfield(L,-2,"type");
  }
  return;
}

Assistant:

static void luv_push_stats_table(lua_State* L, const uv_stat_t* s) {
  const char* type = NULL;
  lua_createtable(L, 0, 23);
  lua_pushinteger(L, s->st_dev);
  lua_setfield(L, -2, "dev");
  lua_pushinteger(L, s->st_mode);
  lua_setfield(L, -2, "mode");
  lua_pushinteger(L, s->st_nlink);
  lua_setfield(L, -2, "nlink");
  lua_pushinteger(L, s->st_uid);
  lua_setfield(L, -2, "uid");
  lua_pushinteger(L, s->st_gid);
  lua_setfield(L, -2, "gid");
  lua_pushinteger(L, s->st_rdev);
  lua_setfield(L, -2, "rdev");
  lua_pushinteger(L, s->st_ino);
  lua_setfield(L, -2, "ino");
  lua_pushinteger(L, s->st_size);
  lua_setfield(L, -2, "size");
  lua_pushinteger(L, s->st_blksize);
  lua_setfield(L, -2, "blksize");
  lua_pushinteger(L, s->st_blocks);
  lua_setfield(L, -2, "blocks");
  lua_pushinteger(L, s->st_flags);
  lua_setfield(L, -2, "flags");
  lua_pushinteger(L, s->st_gen);
  lua_setfield(L, -2, "gen");
  luv_push_timespec_table(L, &s->st_atim);
  lua_setfield(L, -2, "atime");
  luv_push_timespec_table(L, &s->st_mtim);
  lua_setfield(L, -2, "mtime");
  luv_push_timespec_table(L, &s->st_ctim);
  lua_setfield(L, -2, "ctime");
  luv_push_timespec_table(L, &s->st_birthtim);
  lua_setfield(L, -2, "birthtime");
  if (S_ISREG(s->st_mode)) {
    type = "file";
  }
  else if (S_ISDIR(s->st_mode)) {
    type = "directory";
  }
  else if (S_ISLNK(s->st_mode)) {
    type = "link";
  }
  else if (S_ISFIFO(s->st_mode)) {
    type = "fifo";
  }
#ifdef S_ISSOCK
  else if (S_ISSOCK(s->st_mode)) {
    type = "socket";
  }
#endif
  else if (S_ISCHR(s->st_mode)) {
    type = "char";
  }
  else if (S_ISBLK(s->st_mode)) {
    type = "block";
  }
  if (type) {
    lua_pushstring(L, type);
    lua_setfield(L, -2, "type");
  }
}